

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ze_valddi.cpp
# Opt level: O3

ze_result_t
zeGetDriverExpProcAddrTable(ze_api_version_t version,ze_driver_exp_dditable_t *pDdiTable)

{
  ze_result_t zVar1;
  
  if (pDdiTable == (ze_driver_exp_dditable_t *)0x0) {
    zVar1 = ZE_RESULT_ERROR_INVALID_NULL_POINTER;
  }
  else {
    zVar1 = ZE_RESULT_ERROR_UNSUPPORTED_VERSION;
    if (((*validation_layer::context ^ version) < ZE_API_VERSION_1_0) &&
       ((*validation_layer::context & 0xffff) <= (version & 0xffff))) {
      *(ze_pfnDriverRTASFormatCompatibilityCheckExp_t *)(validation_layer::context + 0x38) =
           pDdiTable->pfnRTASFormatCompatibilityCheckExp;
      pDdiTable->pfnRTASFormatCompatibilityCheckExp =
           validation_layer::zeDriverRTASFormatCompatibilityCheckExp;
      return ZE_RESULT_SUCCESS;
    }
  }
  return zVar1;
}

Assistant:

ZE_DLLEXPORT ze_result_t ZE_APICALL
zeGetDriverExpProcAddrTable(
    ze_api_version_t version,                       ///< [in] API version requested
    ze_driver_exp_dditable_t* pDdiTable             ///< [in,out] pointer to table of DDI function pointers
    )
{
    auto& dditable = validation_layer::context.zeDdiTable.DriverExp;

    if( nullptr == pDdiTable )
        return ZE_RESULT_ERROR_INVALID_NULL_POINTER;

    if (ZE_MAJOR_VERSION(validation_layer::context.version) != ZE_MAJOR_VERSION(version) ||
        ZE_MINOR_VERSION(validation_layer::context.version) > ZE_MINOR_VERSION(version))
        return ZE_RESULT_ERROR_UNSUPPORTED_VERSION;

    ze_result_t result = ZE_RESULT_SUCCESS;

    dditable.pfnRTASFormatCompatibilityCheckExp          = pDdiTable->pfnRTASFormatCompatibilityCheckExp;
    pDdiTable->pfnRTASFormatCompatibilityCheckExp        = validation_layer::zeDriverRTASFormatCompatibilityCheckExp;

    return result;
}